

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_cdrop_row.c
# Opt level: O0

int ilu_cdrop_row(superlu_options_t *options,int first,int last,double drop_tol,int quota,int *nnzLj
                 ,double *fill_tol,GlobalLU_t *Glu,float *swork,float *swork2,int lastc)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  milu_t mVar4;
  norm_t nVar5;
  void *pvVar6;
  int_t *piVar7;
  int_t *piVar8;
  int_t *piVar9;
  int iVar10;
  integer iVar11;
  long lVar12;
  real rVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  double local_128;
  int local_104;
  int tmp2;
  int tmp1;
  float ci_1;
  float cr_1;
  float ci;
  float cr;
  float omega;
  singlecomplex t;
  int j_2;
  int j_1;
  int len;
  double tol;
  int local_c0;
  float alpha;
  int nzp;
  int inc_diag;
  int i_1;
  singlecomplex none;
  singlecomplex one;
  norm_t nrm;
  milu_t milu;
  int drop_rule;
  float d_min;
  float d_max;
  int_t *xlusup;
  int_t *xlsub;
  int_t *lsub;
  singlecomplex *lusup;
  float *temp;
  int r;
  int n;
  int m;
  int_t xlsub_first;
  int_t xlusup_first;
  int nzlc;
  int m1;
  int k;
  int j;
  int i;
  double *fill_tol_local;
  int *nnzLj_local;
  double dStack_28;
  int quota_local;
  double drop_tol_local;
  int last_local;
  int first_local;
  superlu_options_t *options_local;
  
  temp._0_4_ = 0;
  pvVar6 = Glu->lusup;
  piVar7 = Glu->lsub;
  piVar8 = Glu->xlsub;
  piVar9 = Glu->xlusup;
  drop_rule = 0;
  milu = 0x3f800000;
  uVar3 = options->ILU_DropRule;
  mVar4 = options->ILU_MILU;
  nVar5 = options->ILU_Norm;
  none.r = 1.0;
  none.i = 0.0;
  _inc_diag = 0xbf800000;
  nzp = 1;
  local_c0 = 0;
  _j = fill_tol;
  fill_tol_local = (double *)nnzLj;
  nnzLj_local._4_4_ = quota;
  dStack_28 = drop_tol;
  drop_tol_local._0_4_ = last;
  drop_tol_local._4_4_ = first;
  _last_local = options;
  dVar15 = pow((double)Glu->n,-1.0 / options->ILU_MILU_Dim);
  tol._4_4_ = (float)dVar15;
  m = piVar9[drop_tol_local._4_4_];
  n = piVar8[drop_tol_local._4_4_];
  r = piVar9[drop_tol_local._4_4_ + 1] - m;
  iVar10 = (drop_tol_local._0_4_ - drop_tol_local._4_4_) + 1;
  xlusup_first = r + -1;
  alpha = (float)(r + 1);
  if (lastc == 0) {
    local_104 = 0;
  }
  else {
    local_104 = piVar9[drop_tol_local._0_4_ + 2] - piVar9[drop_tol_local._0_4_ + 1];
  }
  xlsub_first = local_104;
  if (((r == 0) || (r == iVar10)) || (temp._4_4_ = iVar10, k = iVar10, uVar3 == 0)) {
    *(int *)fill_tol_local = r * iVar10 + *(int *)fill_tol_local;
    options_local._4_4_ = 0;
  }
  else {
    while (k <= xlusup_first) {
      if (nVar5 == ONE_NORM) {
        rVar13 = scasum_((integer *)((long)&temp + 4),
                         (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r);
        swork[(long)k - (long)iVar10] = rVar13 / (float)temp._4_4_;
      }
      else if (nVar5 == TWO_NORM) {
        rVar13 = scnrm2_((integer *)((long)&temp + 4),
                         (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r);
        dVar15 = sqrt((double)temp._4_4_);
        swork[(long)k - (long)iVar10] = (float)((double)rVar13 / dVar15);
      }
      else {
        iVar11 = icamax_((integer *)((long)&temp + 4),
                         (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r);
        nzlc = iVar11 + -1;
        dVar15 = c_abs1((singlecomplex *)((long)pvVar6 + (long)(m + k + r * nzlc) * 8));
        swork[(long)k - (long)iVar10] = (float)dVar15;
      }
      if (((uVar3 & 1) == 0) || (dStack_28 <= (double)swork[(long)k - (long)iVar10])) {
        if ((float)drop_rule < swork[(long)k - (long)iVar10]) {
          drop_rule = (int)swork[(long)k - (long)iVar10];
        }
        if (swork[(long)k - (long)iVar10] < (float)milu) {
          milu = (milu_t)swork[(long)k - (long)iVar10];
        }
        k = k + 1;
      }
      else {
        temp._0_4_ = (int)temp + 1;
        if ((int)temp < 2) {
          cswap_((integer *)((long)&temp + 4),
                 (singlecomplex *)((long)pvVar6 + (long)(m + xlusup_first) * 8),&r,
                 (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r);
          if (mVar4 == SMILU_3) {
            for (m1 = 0; m1 < temp._4_4_; m1 = m1 + 1) {
              dVar15 = c_abs1((singlecomplex *)
                              ((long)pvVar6 + (long)(m + xlusup_first + m1 * r) * 8));
              *(float *)((long)pvVar6 + (long)(m + xlusup_first + m1 * r) * 8) = (float)dVar15;
              *(undefined4 *)((long)pvVar6 + (long)(m + xlusup_first + m1 * r) * 8 + 4) = 0;
            }
          }
        }
        else {
          if (mVar4 != SILU) {
            if (mVar4 - SMILU_1 < 2) {
              caxpy_((integer *)((long)&temp + 4),&none,
                     (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r,
                     (singlecomplex *)((long)pvVar6 + (long)(m + r + -1) * 8),&r);
            }
            else if (mVar4 == SMILU_3) {
              for (m1 = 0; m1 < temp._4_4_; m1 = m1 + 1) {
                dVar15 = c_abs1((singlecomplex *)((long)pvVar6 + (long)(m + k + m1 * r) * 8));
                lVar12 = (long)(m + r + -1 + m1 * r);
                *(float *)((long)pvVar6 + lVar12 * 8) =
                     (float)((double)*(float *)((long)pvVar6 + lVar12 * 8) + dVar15);
              }
            }
          }
          ccopy_((integer *)((long)&temp + 4),
                 (singlecomplex *)((long)pvVar6 + (long)(m + xlusup_first) * 8),&r,
                 (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r);
        }
        piVar7[n + k] = piVar7[n + xlusup_first];
        xlusup_first = xlusup_first + -1;
      }
    }
    dVar15 = ceil((double)nnzLj_local._4_4_ / (double)temp._4_4_);
    nnzLj_local._4_4_ = (int)dVar15;
    if (((uVar3 & 0xe) != 0) && (nnzLj_local._4_4_ < r - (int)temp)) {
      _j_1 = (double)(float)drop_rule;
      if (temp._4_4_ < nnzLj_local._4_4_) {
        if ((uVar3 & 0x100) == 0) {
          j_2 = (xlusup_first - temp._4_4_) + 1;
          scopy_(&j_2,swork,&nzp,swork2,&nzp);
          fVar14 = sqselect(j_2,swork2,nnzLj_local._4_4_ - temp._4_4_);
          _j_1 = (double)fVar14;
        }
        else {
          _j_1 = 1.0 / (double)(1.0 / (float)drop_rule +
                               ((1.0 / (float)milu - 1.0 / (float)drop_rule) *
                               (float)nnzLj_local._4_4_) / (float)((r - temp._4_4_) - (int)temp));
        }
      }
      k = temp._4_4_;
      while (k <= xlusup_first) {
        if (_j_1 < (double)swork[(long)k - (long)iVar10]) {
          k = k + 1;
        }
        else {
          temp._0_4_ = (int)temp + 1;
          if ((int)temp < 2) {
            cswap_((integer *)((long)&temp + 4),
                   (singlecomplex *)((long)pvVar6 + (long)(m + xlusup_first) * 8),&r,
                   (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r);
            if (mVar4 == SMILU_3) {
              for (t.i = 0.0; (int)t.i < temp._4_4_; t.i = (float)((int)t.i + 1)) {
                dVar15 = c_abs1((singlecomplex *)
                                ((long)pvVar6 + (long)(m + xlusup_first + (int)t.i * r) * 8));
                *(float *)((long)pvVar6 + (long)(m + xlusup_first + (int)t.i * r) * 8) =
                     (float)dVar15;
                *(undefined4 *)((long)pvVar6 + (long)(m + xlusup_first + (int)t.i * r) * 8 + 4) = 0;
              }
            }
          }
          else {
            if (mVar4 != SILU) {
              if (mVar4 - SMILU_1 < 2) {
                caxpy_((integer *)((long)&temp + 4),&none,
                       (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r,
                       (singlecomplex *)((long)pvVar6 + (long)(m + r + -1) * 8),&r);
              }
              else if (mVar4 == SMILU_3) {
                for (t.i = 0.0; (int)t.i < temp._4_4_; t.i = (float)((int)t.i + 1)) {
                  dVar15 = c_abs1((singlecomplex *)((long)pvVar6 + (long)(m + k + (int)t.i * r) * 8)
                                 );
                  lVar12 = (long)(m + r + -1 + (int)t.i * r);
                  *(float *)((long)pvVar6 + lVar12 * 8) =
                       (float)((double)*(float *)((long)pvVar6 + lVar12 * 8) + dVar15);
                }
              }
            }
            ccopy_((integer *)((long)&temp + 4),
                   (singlecomplex *)((long)pvVar6 + (long)(m + xlusup_first) * 8),&r,
                   (singlecomplex *)((long)pvVar6 + (long)(m + k) * 8),&r);
          }
          piVar7[n + k] = piVar7[n + xlusup_first];
          xlusup_first = xlusup_first + -1;
          swork[(long)k - (long)iVar10] = swork[(long)xlusup_first - (long)iVar10];
        }
      }
    }
    for (k = temp._4_4_; k < r; k = k + 1) {
      swork[(long)k - (long)iVar10] = 0.0;
    }
    if ((int)temp == 0) {
      *(int *)fill_tol_local = r * temp._4_4_ + *(int *)fill_tol_local;
      options_local._4_4_ = 0;
    }
    else {
      if (mVar4 != SILU) {
        for (t.r = 0.0; (int)t.r < temp._4_4_; t.r = (float)((int)t.r + 1)) {
          _cr = *(singlecomplex *)((long)pvVar6 + (long)(m + r + -1 + (int)t.r * r) * 8);
          if ((cr != 0.0) || (NAN(cr))) {
LAB_00113946:
            dVar15 = (double)tol._4_4_;
            dVar16 = c_abs1((singlecomplex *)&cr);
            if (1.0 <= ((1.0 - dVar15) * 2.0) / dVar16) {
              local_128 = 1.0;
            }
            else {
              dVar15 = (double)tol._4_4_;
              local_128 = c_abs1((singlecomplex *)&cr);
              local_128 = ((1.0 - dVar15) * 2.0) / local_128;
            }
            fVar14 = cr * (float)local_128;
            omega = omega * (float)local_128;
            cr = fVar14;
            switch(mVar4) {
            case SILU:
              break;
            case SMILU_1:
              if ((fVar14 == (float)inc_diag) && (!NAN(fVar14) && !NAN((float)inc_diag))) {
                if ((omega == (float)i_1) && (!NAN(omega) && !NAN((float)i_1))) {
                  *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8) =
                       (float)((double)*(float *)((long)pvVar6 +
                                                 (long)(m + (int)t.r * (int)alpha) * 8) * *_j);
                  *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4) =
                       (float)((double)*(float *)((long)pvVar6 +
                                                 (long)(m + (int)t.r * (int)alpha) * 8 + 4) * *_j);
                  local_c0 = local_c0 + 1;
                  break;
                }
              }
              fVar1 = *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4);
              fVar2 = *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8);
              *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8) =
                   *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8) *
                   (fVar14 + none.r) +
                   -(*(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4) *
                    (omega + none.i));
              *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4) =
                   fVar1 * (fVar14 + none.r) + fVar2 * (omega + none.i);
              break;
            case SMILU_2:
              fVar14 = *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8);
              dVar15 = c_abs1((singlecomplex *)&cr);
              *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8) =
                   (float)((double)fVar14 * (dVar15 + 1.0));
              fVar14 = *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4);
              dVar15 = c_abs1((singlecomplex *)&cr);
              *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4) =
                   (float)((double)fVar14 * (dVar15 + 1.0));
              break;
            case SMILU_3:
              fVar1 = *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4);
              fVar2 = *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8);
              *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8) =
                   *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8) *
                   (fVar14 + none.r) +
                   -(*(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4) *
                    (omega + none.i));
              *(float *)((long)pvVar6 + (long)(m + (int)t.r * (int)alpha) * 8 + 4) =
                   fVar1 * (fVar14 + none.r) + fVar2 * (omega + none.i);
            }
          }
          else if ((omega != 0.0) || (NAN(omega))) goto LAB_00113946;
        }
        if (0 < local_c0) {
          *_j = (double)-local_c0;
        }
      }
      iVar10 = r - (int)temp;
      for (m1 = 1; m1 < temp._4_4_; m1 = m1 + 1) {
        for (k = 0; k < iVar10; k = k + 1) {
          *(undefined8 *)((long)pvVar6 + (long)(k + m + m1 * iVar10) * 8) =
               *(undefined8 *)((long)pvVar6 + (long)(k + m + m1 * r) * 8);
        }
      }
      for (k = 0; k < xlsub_first; k = k + 1) {
        *(undefined8 *)((long)pvVar6 + (long)(m + k + temp._4_4_ * iVar10) * 8) =
             *(undefined8 *)((long)pvVar6 + (long)(m + k + temp._4_4_ * r) * 8);
      }
      for (k = 0; iVar10 = drop_tol_local._4_4_, k < xlsub_first; k = k + 1) {
        piVar7[(piVar8[drop_tol_local._0_4_ + 1] - (int)temp) + k] =
             piVar7[piVar8[drop_tol_local._0_4_ + 1] + k];
      }
      while (k = iVar10 + 1, k <= drop_tol_local._0_4_ + 1) {
        piVar9[k] = piVar9[k] - (int)temp * (k - drop_tol_local._4_4_);
        piVar8[k] = piVar8[k] - (int)temp;
        iVar10 = k;
      }
      if (lastc != 0) {
        piVar9[drop_tol_local._0_4_ + 2] = piVar9[drop_tol_local._0_4_ + 2] - (int)temp * temp._4_4_
        ;
        piVar8[drop_tol_local._0_4_ + 2] = piVar8[drop_tol_local._0_4_ + 2] - (int)temp;
      }
      *(int *)fill_tol_local = (r - (int)temp) * temp._4_4_ + *(int *)fill_tol_local;
      options_local._4_4_ = (int)temp;
    }
  }
  return options_local._4_4_;
}

Assistant:

int ilu_cdrop_row(
	superlu_options_t *options, /* options */
	int    first,	    /* index of the first column in the supernode */
	int    last,	    /* index of the last column in the supernode */
	double drop_tol,    /* dropping parameter */
	int    quota,	    /* maximum nonzero entries allowed */
	int    *nnzLj,	    /* in/out number of nonzeros in L(:, 1:last) */
	double *fill_tol,   /* in/out - on exit, fill_tol=-num_zero_pivots,
			     * does not change if options->ILU_MILU != SMILU1 */
	GlobalLU_t *Glu,    /* modified */
	float swork[],   /* working space
	                     * the length of swork[] should be no less than
			     * the number of rows in the supernode */
	float swork2[], /* working space with the same size as swork[],
			     * used only by the second dropping rule */
	int    lastc	    /* if lastc == 0, there is nothing after the
			     * working supernode [first:last];
			     * if lastc == 1, there is one more column after
			     * the working supernode. */ )
{
    register int i, j, k, m1;
    register int nzlc; /* number of nonzeros in column last+1 */
    int_t xlusup_first, xlsub_first;
    int m, n; /* m x n is the size of the supernode */
    int r = 0; /* number of dropped rows */
    register float *temp;
    register singlecomplex *lusup = (singlecomplex *) Glu->lusup;
    int_t *lsub = Glu->lsub;
    int_t *xlsub = Glu->xlsub;
    int_t *xlusup = Glu->xlusup;
    register float d_max = 0.0, d_min = 1.0;
    int    drop_rule = options->ILU_DropRule;
    milu_t milu = options->ILU_MILU;
    norm_t nrm = options->ILU_Norm;
    singlecomplex one = {1.0, 0.0};
    singlecomplex none = {-1.0, 0.0};
    int i_1 = 1;
    int inc_diag; /* inc_diag = m + 1 */
    int nzp = 0;  /* number of zero pivots */
    float alpha = pow((double)(Glu->n), -1.0 / options->ILU_MILU_Dim);

    xlusup_first = xlusup[first];
    xlsub_first = xlsub[first];
    m = xlusup[first + 1] - xlusup_first;
    n = last - first + 1;
    m1 = m - 1;
    inc_diag = m + 1;
    nzlc = lastc ? (xlusup[last + 2] - xlusup[last + 1]) : 0;
    temp = swork - n;

    /* Quick return if nothing to do. */
    if (m == 0 || m == n || drop_rule == NODROP)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* basic dropping: ILU(tau) */
    for (i = n; i <= m1; )
    {
	/* the average abs value of ith row */
	switch (nrm)
	{
	    case ONE_NORM:
		temp[i] = scasum_(&n, &lusup[xlusup_first + i], &m) / (double)n;
		break;
	    case TWO_NORM:
		temp[i] = scnrm2_(&n, &lusup[xlusup_first + i], &m)
		    / sqrt((double)n);
		break;
	    case INF_NORM:
	    default:
		k = icamax_(&n, &lusup[xlusup_first + i], &m) - 1;
		temp[i] = c_abs1(&lusup[xlusup_first + i + m * k]);
		break;
	}

	/* drop small entries due to drop_tol */
	if (drop_rule & DROP_BASIC && temp[i] < drop_tol)
	{
	    r++;
	    /* drop the current row and move the last undropped row here */
	    if (r > 1) /* add to last row */
	    {
		/* accumulate the sum (for MILU) */
		switch (milu)
		{
		    case SMILU_1:
		    case SMILU_2:
			caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				&lusup[xlusup_first + m - 1], &m);
			break;
		    case SMILU_3:
			for (j = 0; j < n; j++)
			    lusup[xlusup_first + (m - 1) + j * m].r +=
				    c_abs1(&lusup[xlusup_first + i + j * m]);
			break;
		    case SILU:
		    default:
			break;
		}
		ccopy_(&n, &lusup[xlusup_first + m1], &m,
                       &lusup[xlusup_first + i], &m);
	    } /* if (r > 1) */
	    else /* move to last row */
	    {
		cswap_(&n, &lusup[xlusup_first + m1], &m,
			&lusup[xlusup_first + i], &m);
		if (milu == SMILU_3)
		    for (j = 0; j < n; j++) {
			lusup[xlusup_first + m1 + j * m].r =
				c_abs1(&lusup[xlusup_first + m1 + j * m]);
			lusup[xlusup_first + m1 + j * m].i = 0.0;
                    }
	    }
	    lsub[xlsub_first + i] = lsub[xlsub_first + m1];
	    m1--;
	    continue;
	} /* if dropping */
	else
	{
	    if (temp[i] > d_max) d_max = temp[i];
	    if (temp[i] < d_min) d_min = temp[i];
	}
	i++;
    } /* for */

    /* Secondary dropping: drop more rows according to the quota. */
    quota = ceil((double)quota / (double)n);
    if (drop_rule & DROP_SECONDARY && m - r > quota)
    {
	register double tol = d_max;

	/* Calculate the second dropping tolerance */
	if (quota > n)
	{
	    if (drop_rule & DROP_INTERP) /* by interpolation */
	    {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / (m - n - r));
	    }
	    else /* by quick select */
	    {
		int len = m1 - n + 1;
		scopy_(&len, swork, &i_1, swork2, &i_1);
		tol = sqselect(len, swork2, quota - n);
#if 0
		register int *itemp = iwork - n;
		A = temp;
		for (i = n; i <= m1; i++) itemp[i] = i;
		qsort(iwork, m1 - n + 1, sizeof(int), _compare_);
		tol = temp[itemp[quota]];
#endif
	    }
	}

	for (i = n; i <= m1; )
	{
	    if (temp[i] <= tol)
	    {
		register int j;
		r++;
		/* drop the current row and move the last undropped row here */
		if (r > 1) /* add to last row */
		{
		    /* accumulate the sum (for MILU) */
		    switch (milu)
		    {
			case SMILU_1:
			case SMILU_2:
			    caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				    &lusup[xlusup_first + m - 1], &m);
			    break;
			case SMILU_3:
			    for (j = 0; j < n; j++)
				lusup[xlusup_first + (m - 1) + j * m].r +=
   				  c_abs1(&lusup[xlusup_first + i + j * m]);
			    break;
			case SILU:
			default:
			    break;
		    }
		    ccopy_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		} /* if (r > 1) */
		else /* move to last row */
		{
		    cswap_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		    if (milu == SMILU_3)
			for (j = 0; j < n; j++) {
			    lusup[xlusup_first + m1 + j * m].r =
				    c_abs1(&lusup[xlusup_first + m1 + j * m]);
			    lusup[xlusup_first + m1 + j * m].i = 0.0;
                        }
		}
		lsub[xlsub_first + i] = lsub[xlsub_first + m1];
		m1--;
		temp[i] = temp[m1];

		continue;
	    }
	    i++;

	} /* for */

    } /* if secondary dropping */

    for (i = n; i < m; i++) temp[i] = 0.0;

    if (r == 0)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* add dropped entries to the diagonal */
    if (milu != SILU)
    {
	register int j;
	singlecomplex t;
	float omega;
	for (j = 0; j < n; j++)
	{
	    t = lusup[xlusup_first + (m - 1) + j * m];
            if (t.r == 0.0 && t.i == 0.0) continue;
            omega = SUPERLU_MIN(2.0 * (1.0 - alpha) / c_abs1(&t), 1.0);
	    cs_mult(&t, &t, omega);

 	    switch (milu)
	    {
		case SMILU_1:
		    if ( !(c_eq(&t, &none)) ) {
                        c_add(&t, &t, &one);
                        cc_mult(&lusup[xlusup_first + j * inc_diag],
			                  &lusup[xlusup_first + j * inc_diag],
                                          &t);
                    }
		    else
		    {
                        cs_mult(
                                &lusup[xlusup_first + j * inc_diag],
			        &lusup[xlusup_first + j * inc_diag],
                                *fill_tol);
#ifdef DEBUG
			printf("[1] ZERO PIVOT: FILL col %d.\n", first + j);
			fflush(stdout);
#endif
			nzp++;
		    }
		    break;
		case SMILU_2:
                    cs_mult(&lusup[xlusup_first + j * inc_diag],
                                          &lusup[xlusup_first + j * inc_diag],
                                          1.0 + c_abs1(&t));
		    break;
		case SMILU_3:
                    c_add(&t, &t, &one);
                    cc_mult(&lusup[xlusup_first + j * inc_diag],
	                              &lusup[xlusup_first + j * inc_diag],
                                      &t);
		    break;
		case SILU:
		default:
		    break;
	    }
	}
	if (nzp > 0) *fill_tol = -nzp;
    }

    /* Remove dropped entries from the memory and fix the pointers. */
    m1 = m - r;
    for (j = 1; j < n; j++)
    {
	register int tmp1, tmp2;
	tmp1 = xlusup_first + j * m1;
	tmp2 = xlusup_first + j * m;
	for (i = 0; i < m1; i++)
	    lusup[i + tmp1] = lusup[i + tmp2];
    }
    for (i = 0; i < nzlc; i++)
	lusup[xlusup_first + i + n * m1] = lusup[xlusup_first + i + n * m];
    for (i = 0; i < nzlc; i++)
	lsub[xlsub[last + 1] - r + i] = lsub[xlsub[last + 1] + i];
    for (i = first + 1; i <= last + 1; i++)
    {
	xlusup[i] -= r * (i - first);
	xlsub[i] -= r;
    }
    if (lastc)
    {
	xlusup[last + 2] -= r * n;
	xlsub[last + 2] -= r;
    }

    *nnzLj += (m - r) * n;
    return r;
}